

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 挑7.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  uint __len;
  int iVar7;
  uint __val;
  int n;
  string __str;
  int local_54;
  char *local_50 [2];
  char local_40 [16];
  
  plVar4 = (long *)std::istream::operator>>((istream *)&std::cin,&local_54);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    do {
      iVar7 = 0;
      if (5 < local_54) {
        iVar7 = 0;
        __val = 6;
        do {
          if (__val * -0x49249249 < 0x24924925) {
LAB_001012f9:
            iVar7 = iVar7 + 1;
          }
          else {
            __len = 1;
            if (9 < __val) {
              uVar6 = (ulong)__val;
              uVar2 = 4;
              do {
                __len = uVar2;
                uVar3 = (uint)uVar6;
                if (uVar3 < 100) {
                  __len = __len - 2;
                  goto LAB_001012af;
                }
                if (uVar3 < 1000) {
                  __len = __len - 1;
                  goto LAB_001012af;
                }
                if (uVar3 < 10000) goto LAB_001012af;
                uVar6 = uVar6 / 10000;
                uVar2 = __len + 4;
              } while (99999 < uVar3);
              __len = __len + 1;
            }
LAB_001012af:
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],__len,__val);
            lVar5 = std::__cxx11::string::find((char)local_50,0x37);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            if (lVar5 != -1) goto LAB_001012f9;
          }
          bVar1 = (int)__val < local_54;
          __val = __val + 1;
        } while (bVar1);
      }
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      plVar4 = (long *)std::istream::operator>>((istream *)&std::cin,&local_54);
    } while ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0);
  }
  return 0;
}

Assistant:

int main()
{
    int n;
    while(cin>>n)
    {
        int sum(0);
        for (int i=6;i<n+1;i++)
        {
            if(i%7 == 0 || to_string(i).find('7') != -1)
                sum++;
        }

        cout<<sum<<endl;
        //cout<<stoi("23454")<<endl;
        //stox,以及to_string两个函数都是std中的成员，不需要其他头文件引用
    }
    return 0;
}